

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *buffer,size_t size,
          size_t chunkSize,CrtAllocator *baseAllocator)

{
  SharedData *pSVar1;
  bool bVar2;
  
  this->chunk_capacity_ = chunkSize;
  this->baseAllocator_ = baseAllocator;
  if (buffer == (void *)0x0) {
    __assert_fail("buf != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/allocators.h"
                  ,0x196,
                  "static void *rapidjson::MemoryPoolAllocator<>::AlignBuffer(void *, size_t &) [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  pSVar1 = (SharedData *)buffer;
  if (((ulong)buffer & 7) != 0) {
    pSVar1 = (SharedData *)((long)buffer + 7U & 0xfffffffffffffff8);
    bVar2 = size < (ulong)((long)pSVar1 - (long)buffer);
    size = size - ((long)pSVar1 - (long)buffer);
    if (bVar2) {
      __assert_fail("size >= abuf - ubuf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/allocators.h"
                    ,0x19b,
                    "static void *rapidjson::MemoryPoolAllocator<>::AlignBuffer(void *, size_t &) [BaseAllocator = rapidjson::CrtAllocator]"
                   );
    }
  }
  this->shared_ = pSVar1;
  if (size < 0x38) {
    __assert_fail("size >= SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/allocators.h"
                  ,0xce,
                  "rapidjson::MemoryPoolAllocator<>::MemoryPoolAllocator(void *, size_t, size_t, BaseAllocator *) [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  pSVar1->chunkHead = (ChunkHeader *)(pSVar1 + 1);
  pSVar1[1].chunkHead = (ChunkHeader *)(size - 0x38);
  pSVar1->ownBaseAllocator = (CrtAllocator *)0x0;
  pSVar1->ownBuffer = false;
  pSVar1[1].ownBaseAllocator = (CrtAllocator *)0x0;
  pSVar1[1].refcount = 0;
  pSVar1->refcount = 1;
  return;
}

Assistant:

MemoryPoolAllocator(void *buffer, size_t size, size_t chunkSize = kDefaultChunkCapacity, BaseAllocator* baseAllocator = 0) :
        chunk_capacity_(chunkSize),
        baseAllocator_(baseAllocator),
        shared_(static_cast<SharedData*>(AlignBuffer(buffer, size)))
    {
        RAPIDJSON_ASSERT(size >= SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER);
        shared_->chunkHead = GetChunkHead(shared_);
        shared_->chunkHead->capacity = size - SIZEOF_SHARED_DATA - SIZEOF_CHUNK_HEADER;
        shared_->chunkHead->size = 0;
        shared_->chunkHead->next = 0;
        shared_->ownBaseAllocator = 0;
        shared_->ownBuffer = false;
        shared_->refcount = 1;
    }